

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

void * Sat_ProofCore(sat_solver2 *s)

{
  int iVar1;
  Prf_Man_t *pPVar2;
  Vec_Wrd_t *pVVar3;
  int iVar4;
  void *pvVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  if (s->pPrf1 != (Vec_Set_t *)0x0) {
    pvVar5 = Proof_DeriveCore(s->pPrf1,s->hProofLast);
    return pvVar5;
  }
  pPVar2 = s->pPrf2;
  if (pPVar2 == (Prf_Man_t *)0x0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    pVVar3 = pPVar2->vInfo;
    dVar12 = 0.0;
    dVar11 = 0.0;
    if (pVVar3 != (Vec_Wrd_t *)0x0) {
      dVar11 = (double)pVVar3->nCap * 8.0 + 16.0;
    }
    if (pPVar2->vSaved != (Vec_Int_t *)0x0) {
      dVar12 = (double)pPVar2->vSaved->nCap * 4.0 + 16.0;
    }
    dVar12 = dVar11 + dVar12 + 48.0;
    dVar11 = s->dPrfMemory;
    if (s->dPrfMemory <= dVar12) {
      dVar11 = dVar12;
    }
    s->dPrfMemory = dVar11;
    if (pPVar2->iFirst < 0) {
      __assert_fail("p->iFirst >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x123,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    if (pPVar2->pInfo != (word *)0x0) {
      __assert_fail("p->pInfo == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x124,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    iVar9 = pPVar2->nWords;
    iVar1 = pVVar3->nSize;
    iVar4 = iVar1 / iVar9;
    if (iVar4 < 1) {
      __assert_fail("Prf_ManSize(p) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x125,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    p = (Vec_Int_t *)malloc(0x10);
    p->nSize = 0;
    p->nCap = iVar9 << 6;
    piVar6 = (int *)malloc((long)iVar9 << 8);
    p->pArray = piVar6;
    uVar8 = (iVar4 + -1) * iVar9;
    if (((int)uVar8 < 0) || (iVar1 <= (int)uVar8)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    pPVar2->pInfo = pVVar3->pArray + uVar8;
    pVVar7 = pPVar2->vId2Pr;
    if (pVVar7 == (Vec_Int_t *)0x0) {
      if (0 < iVar9) {
        uVar8 = 0;
        do {
          if ((*(uint *)((long)pPVar2->pInfo + (ulong)(uVar8 >> 5) * 4) >> (uVar8 & 0x1f) & 1) != 0)
          {
            Vec_IntPush(p,uVar8);
            iVar9 = pPVar2->nWords;
          }
          uVar8 = uVar8 + 1;
        } while (SBORROW4(uVar8,iVar9 * 0x40) != (int)(uVar8 + iVar9 * -0x40) < 0);
      }
    }
    else if (0 < pVVar7->nSize) {
      lVar10 = 0;
      do {
        uVar8 = pVVar7->pArray[lVar10];
        if (-1 < (int)uVar8) {
          if (pPVar2->nWords * 0x40 <= (int)uVar8) {
            __assert_fail("Entry < 64 * p->nWords",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x134,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
          }
          if ((*(uint *)((long)pPVar2->pInfo + (ulong)(uVar8 >> 5) * 4) >> (uVar8 & 0x1f) & 1) != 0)
          {
            Vec_IntPush(p,(int)lVar10);
            pVVar7 = pPVar2->vId2Pr;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar7->nSize);
    }
    pPVar2->pInfo = (word *)0x0;
    qsort(p->pArray,(long)p->nSize,4,Vec_IntSortCompare2);
  }
  return p;
}

Assistant:

void * Sat_ProofCore( sat_solver2 * s )
{
    extern void * Proof_DeriveCore( Vec_Set_t * vProof, int hRoot );
    if ( s->pPrf1 )
        return Proof_DeriveCore( s->pPrf1, s->hProofLast );
    if ( s->pPrf2 )
    {
        s->dPrfMemory = Abc_MaxDouble( s->dPrfMemory, Prf_ManMemory(s->pPrf2) );
        return Prf_ManUnsatCore( s->pPrf2 );
    }
    return NULL;
}